

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

void __thiscall Graph::prohibitTransition(Graph *this,int left,int mid,int right)

{
  pointer pvVar1;
  Edge *pEVar2;
  bool bVar3;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> _Var4;
  pointer ppEVar5;
  pointer ppEVar6;
  Edge *unaff_R15;
  Edge *rightEdge;
  Edge *leftEdge;
  Edge *local_40;
  Edge *local_38;
  
  pvVar1 = (this->adjList).
           super__Vector_base<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppEVar6 = *(pointer *)&pvVar1[mid].super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl;
  ppEVar5 = *(pointer *)
             ((long)&pvVar1[mid].super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl + 8);
  do {
    pEVar2 = *ppEVar6;
    bVar3 = Edge::connectsTo(pEVar2,left);
    if (bVar3) {
      unaff_R15 = pEVar2;
      local_38 = pEVar2;
    }
    bVar3 = Edge::connectsTo(pEVar2,right);
    if (bVar3) {
      local_40 = pEVar2;
    }
    ppEVar6 = ppEVar6 + 1;
  } while (ppEVar6 != ppEVar5);
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<Edge**,std::vector<Edge*,std::allocator<Edge*>>>,__gnu_cxx::__ops::_Iter_equals_val<Edge*const>>
                    ((unaff_R15->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (unaff_R15->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_40);
  ppEVar5 = (unaff_R15->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppEVar6 = _Var4._M_current + 1;
  if (ppEVar6 != ppEVar5) {
    memmove(_Var4._M_current,ppEVar6,(long)ppEVar5 - (long)ppEVar6);
    ppEVar5 = (unaff_R15->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  pEVar2 = local_40;
  (unaff_R15->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppEVar5 + -1;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<Edge**,std::vector<Edge*,std::allocator<Edge*>>>,__gnu_cxx::__ops::_Iter_equals_val<Edge*const>>
                    ((local_40->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (local_40->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_38);
  ppEVar5 = (pEVar2->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppEVar6 = _Var4._M_current + 1;
  if (ppEVar6 != ppEVar5) {
    memmove(_Var4._M_current,ppEVar6,(long)ppEVar5 - (long)ppEVar6);
    ppEVar5 = (pEVar2->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  (pEVar2->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppEVar5 + -1;
  return;
}

Assistant:

void Graph::prohibitTransition(int left, int mid, int right) {
  Edge* leftEdge;
  Edge* rightEdge;
  for(Edge* edge: adjList[mid]) {
    if(edge->connectsTo(left)) leftEdge = edge;
    if(edge->connectsTo(right)) rightEdge = edge;
  }
  leftEdge->neighbours.erase(std::find(leftEdge->neighbours.begin(), leftEdge->neighbours.end(), rightEdge));
  rightEdge->neighbours.erase(std::find(rightEdge->neighbours.begin(), rightEdge->neighbours.end(), leftEdge));
}